

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_constructor.c
# Opt level: O0

void constructor_destroy(constructor ctor)

{
  constructor_node pcVar1;
  constructor in_RDI;
  constructor_node node;
  size_t index;
  ulong index_00;
  
  if (in_RDI != (constructor)0x0) {
    for (index_00 = 0; index_00 < in_RDI->count; index_00 = index_00 + 1) {
      pcVar1 = constructor_at(in_RDI,index_00);
      if ((pcVar1 != (constructor_node)0x0) && (pcVar1->name != (char *)0x0)) {
        free(pcVar1->name);
      }
    }
    set_destroy(in_RDI->map);
    free(in_RDI);
  }
  return;
}

Assistant:

void constructor_destroy(constructor ctor)
{
	if (ctor != NULL)
	{
		size_t index;

		for (index = 0; index < ctor->count; ++index)
		{
			constructor_node node = constructor_at(ctor, index);

			if (node != NULL && node->name != NULL)
			{
				free(node->name);
			}
		}

		set_destroy(ctor->map);

		free(ctor);
	}
}